

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_view_suite.cpp
# Opt level: O2

void pop_suite::pop_increasing(void)

{
  array<int,_4UL> expect;
  array<int,_4UL> array;
  type local_58 [2];
  priority_view<int,_18446744073709551615UL,_std::less<int>_> span;
  
  span.member.span.member.tail = local_58;
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.span.member.head = array._M_elems;
  span.member.last = array._M_elems;
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::push(&span,0xb);
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::push(&span,0x16);
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::push(&span,0x21);
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::push(&span,0x2c);
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x16;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x1f0,"void pop_suite::pop_increasing()",array._M_elems,local_58,expect._M_elems,
             array._M_elems);
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::pop(&span);
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0xb;
  expect._M_elems[2] = 0x16;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x1f7,"void pop_suite::pop_increasing()",array._M_elems,local_58,expect._M_elems,
             array._M_elems);
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::pop(&span);
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0xb;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x1fd,"void pop_suite::pop_increasing()",array._M_elems,local_58,expect._M_elems,
             array._M_elems);
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::pop(&span);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x203,"void pop_suite::pop_increasing()",array._M_elems,local_58,expect._M_elems,
             array._M_elems);
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::pop(&span);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x209,"void pop_suite::pop_increasing()",array._M_elems,local_58,expect._M_elems,
             array._M_elems);
  return;
}

Assistant:

void pop_increasing()
{
    std::array<int, 4> array = {};
    priority_view<int> span(array.begin(), array.end());
    span.push(11);
    span.push(22);
    span.push(33);
    span.push(44);
    {
        std::array<int, 4> expect = { 44, 33, 22, 11 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }

    span.pop();
    {
        std::array<int, 4> expect = { 33, 11, 22, 44 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.pop();
    {
        std::array<int, 4> expect = { 22, 11, 33, 44 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.pop();
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.pop();
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
}